

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::Convolution3DLayerParams::_InternalParse
          (Convolution3DLayerParams *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  bool bVar2;
  WeightParams *msg;
  uint64_t value;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  char cVar6;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *p;
  Arena *pAVar8;
  pair<const_char_*,_unsigned_long> pVar9;
  pair<const_char_*,_unsigned_int> pVar10;
  byte *local_48;
  InternalMetadata *local_40;
  RepeatedField<unsigned_long> *local_38;
  
  local_48 = (byte *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
  if (!bVar2) {
    local_38 = &this->outputshape_;
    local_40 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *local_48;
      uVar7 = (uint)bVar1;
      p = local_48 + 1;
      if ((char)bVar1 < '\0') {
        uVar7 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar10 = google::protobuf::internal::ReadTagFallback((char *)local_48,uVar7);
          p = (byte *)pVar10.first;
          uVar7 = pVar10.second;
        }
        else {
          p = local_48 + 2;
        }
      }
      uVar3 = uVar7 >> 3;
      cVar6 = (char)uVar7;
      local_48 = p;
      if (uVar3 < 0x32) {
        if (uVar3 < 0x14) {
          if (uVar3 == 1) {
            if (cVar6 != '\b') goto switchD_002676d6_caseD_17;
            bVar1 = *p;
            uVar7 = (uint)bVar1;
            local_48 = p + 1;
            if ((char)bVar1 < '\0') {
              uVar7 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
              if ((char)*local_48 < '\0') {
                local_48 = p;
                pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar7);
                local_48 = (byte *)pVar10.first;
                this->outputchannels_ = pVar10.second;
                goto joined_r0x00267f23;
              }
              local_48 = p + 2;
            }
            this->outputchannels_ = uVar7;
          }
          else if (uVar3 == 2) {
            if (cVar6 != '\x10') goto switchD_002676d6_caseD_17;
            bVar1 = *p;
            uVar7 = (uint)bVar1;
            local_48 = p + 1;
            if ((char)bVar1 < '\0') {
              uVar7 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
              if ((char)*local_48 < '\0') {
                local_48 = p;
                pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar7);
                local_48 = (byte *)pVar10.first;
                this->inputchannels_ = pVar10.second;
                goto joined_r0x00267f23;
              }
              local_48 = p + 2;
            }
            this->inputchannels_ = uVar7;
          }
          else {
            if ((uVar3 != 10) || (cVar6 != 'P')) goto switchD_002676d6_caseD_17;
            bVar1 = *p;
            uVar7 = (uint)bVar1;
            local_48 = p + 1;
            if ((char)bVar1 < '\0') {
              uVar7 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
              if ((char)*local_48 < '\0') {
                local_48 = p;
                pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar7);
                local_48 = (byte *)pVar10.first;
                this->ngroups_ = pVar10.second;
                goto joined_r0x00267f23;
              }
              local_48 = p + 2;
            }
            this->ngroups_ = uVar7;
          }
        }
        else {
          if (uVar3 < 0x28) {
            switch(uVar3) {
            case 0x14:
              if (cVar6 == -0x60) {
                bVar1 = *p;
                uVar7 = (uint)bVar1;
                local_48 = p + 1;
                if ((char)bVar1 < '\0') {
                  uVar7 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
                  if ((char)*local_48 < '\0') {
                    local_48 = p;
                    pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar7);
                    local_48 = (byte *)pVar10.first;
                    this->kerneldepth_ = pVar10.second;
                    goto joined_r0x00267f23;
                  }
                  local_48 = p + 2;
                }
                this->kerneldepth_ = uVar7;
                goto LAB_00267f64;
              }
              break;
            case 0x15:
              if (cVar6 == -0x58) {
                bVar1 = *p;
                uVar7 = (uint)bVar1;
                local_48 = p + 1;
                if ((char)bVar1 < '\0') {
                  uVar7 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
                  if ((char)*local_48 < '\0') {
                    local_48 = p;
                    pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar7);
                    local_48 = (byte *)pVar10.first;
                    this->kernelheight_ = pVar10.second;
                    goto joined_r0x00267f23;
                  }
                  local_48 = p + 2;
                }
                this->kernelheight_ = uVar7;
                goto LAB_00267f64;
              }
              break;
            case 0x16:
              if (cVar6 == -0x50) {
                bVar1 = *p;
                uVar7 = (uint)bVar1;
                local_48 = p + 1;
                if ((char)bVar1 < '\0') {
                  uVar7 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
                  if ((char)*local_48 < '\0') {
                    local_48 = p;
                    pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar7);
                    local_48 = (byte *)pVar10.first;
                    this->kernelwidth_ = pVar10.second;
                    goto joined_r0x00267f23;
                  }
                  local_48 = p + 2;
                }
                this->kernelwidth_ = uVar7;
                goto LAB_00267f64;
              }
              break;
            case 0x1f:
              if (cVar6 == -8) {
                bVar1 = *p;
                uVar7 = (uint)bVar1;
                local_48 = p + 1;
                if ((char)bVar1 < '\0') {
                  uVar7 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
                  if ((char)*local_48 < '\0') {
                    local_48 = p;
                    pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar7);
                    local_48 = (byte *)pVar10.first;
                    this->stridedepth_ = pVar10.second;
                    goto joined_r0x00267f23;
                  }
                  local_48 = p + 2;
                }
                this->stridedepth_ = uVar7;
                goto LAB_00267f64;
              }
              break;
            case 0x20:
              if (cVar6 == '\0') {
                bVar1 = *p;
                uVar7 = (uint)bVar1;
                local_48 = p + 1;
                if ((char)bVar1 < '\0') {
                  uVar7 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
                  if ((char)*local_48 < '\0') {
                    local_48 = p;
                    pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar7);
                    local_48 = (byte *)pVar10.first;
                    this->strideheight_ = pVar10.second;
                    goto joined_r0x00267f23;
                  }
                  local_48 = p + 2;
                }
                this->strideheight_ = uVar7;
                goto LAB_00267f64;
              }
              break;
            case 0x21:
              if (cVar6 == '\b') {
                bVar1 = *p;
                uVar7 = (uint)bVar1;
                local_48 = p + 1;
                if ((char)bVar1 < '\0') {
                  uVar7 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
                  if ((char)*local_48 < '\0') {
                    local_48 = p;
                    pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar7);
                    local_48 = (byte *)pVar10.first;
                    this->stridewidth_ = pVar10.second;
                    goto joined_r0x00267f23;
                  }
                  local_48 = p + 2;
                }
                this->stridewidth_ = uVar7;
                goto LAB_00267f64;
              }
            }
            goto switchD_002676d6_caseD_17;
          }
          if (uVar3 == 0x28) {
            if (cVar6 != '@') goto switchD_002676d6_caseD_17;
            bVar1 = *p;
            uVar7 = (uint)bVar1;
            local_48 = p + 1;
            if ((char)bVar1 < '\0') {
              uVar7 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
              if ((char)*local_48 < '\0') {
                local_48 = p;
                pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar7);
                local_48 = (byte *)pVar10.first;
                this->dilationdepth_ = pVar10.second;
                goto joined_r0x00267f23;
              }
              local_48 = p + 2;
            }
            this->dilationdepth_ = uVar7;
          }
          else if (uVar3 == 0x29) {
            if (cVar6 != 'H') goto switchD_002676d6_caseD_17;
            bVar1 = *p;
            uVar7 = (uint)bVar1;
            local_48 = p + 1;
            if ((char)bVar1 < '\0') {
              uVar7 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
              if ((char)*local_48 < '\0') {
                local_48 = p;
                pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar7);
                local_48 = (byte *)pVar10.first;
                this->dilationheight_ = pVar10.second;
                goto joined_r0x00267f23;
              }
              local_48 = p + 2;
            }
            this->dilationheight_ = uVar7;
          }
          else {
            if ((uVar3 != 0x2a) || (cVar6 != 'P')) goto switchD_002676d6_caseD_17;
            bVar1 = *p;
            uVar7 = (uint)bVar1;
            local_48 = p + 1;
            if ((char)bVar1 < '\0') {
              uVar7 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
              if ((char)*local_48 < '\0') {
                local_48 = p;
                pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar7);
                local_48 = (byte *)pVar10.first;
                this->dilationwidth_ = pVar10.second;
                goto joined_r0x00267f23;
              }
              local_48 = p + 2;
            }
            this->dilationwidth_ = uVar7;
          }
        }
      }
      else {
        if (uVar3 < 0x46) {
          if (uVar3 == 0x32) {
            if (cVar6 == -0x70) {
              uVar4 = (ulong)(char)*p;
              local_48 = p + 1;
              if ((long)uVar4 < 0) {
                uVar7 = ((uint)*local_48 * 0x80 + (uint)*p) - 0x80;
                if ((char)*local_48 < '\0') {
                  local_48 = p;
                  pVar9 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
                  local_48 = (byte *)pVar9.first;
                  this->hasbias_ = pVar9.second != 0;
                  goto joined_r0x00267f23;
                }
                uVar4 = (ulong)uVar7;
                local_48 = p + 2;
              }
              this->hasbias_ = uVar4 != 0;
              goto LAB_00267f64;
            }
          }
          else if (uVar3 == 0x3c) {
            if (cVar6 == -0x1e) {
              msg = this->weights_;
              if (msg == (WeightParams *)0x0) {
                pAVar8 = (Arena *)(local_40->ptr_ & 0xfffffffffffffffc);
                if ((local_40->ptr_ & 1U) != 0) {
                  pAVar8 = *(Arena **)pAVar8;
                }
                msg = google::protobuf::Arena::
                      CreateMaybeMessage<CoreML::Specification::WeightParams>(pAVar8);
                this->weights_ = msg;
              }
              goto LAB_00267d29;
            }
          }
          else if ((uVar3 == 0x3d) && (cVar6 == -0x16)) {
            msg = this->bias_;
            if (msg == (WeightParams *)0x0) {
              pAVar8 = (Arena *)(local_40->ptr_ & 0xfffffffffffffffc);
              if ((local_40->ptr_ & 1U) != 0) {
                pAVar8 = *(Arena **)pAVar8;
              }
              msg = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                              (pAVar8);
              this->bias_ = msg;
            }
LAB_00267d29:
            local_48 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                         (ctx,&msg->super_MessageLite,(char *)local_48);
            goto joined_r0x00267f23;
          }
          goto switchD_002676d6_caseD_17;
        }
        switch(uVar3) {
        case 0x46:
          if (cVar6 == '0') {
            uVar4 = (ulong)(char)*p;
            local_48 = p + 1;
            if ((long)uVar4 < 0) {
              uVar7 = ((uint)*local_48 * 0x80 + (uint)*p) - 0x80;
              if (-1 < (char)*local_48) {
                uVar4 = (ulong)uVar7;
                local_48 = p + 2;
                goto LAB_0026776d;
              }
              local_48 = p;
              pVar9 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
              iVar5 = (int)pVar9.second;
              local_48 = (byte *)pVar9.first;
              if (local_48 == (byte *)0x0) {
                return (char *)0x0;
              }
            }
            else {
LAB_0026776d:
              iVar5 = (int)uVar4;
            }
            this->paddingtype_ = iVar5;
            goto LAB_00267f64;
          }
          break;
        case 0x50:
          break;
        case 0x51:
          if (cVar6 == -0x78) {
            bVar1 = *p;
            uVar7 = (uint)bVar1;
            local_48 = p + 1;
            if ((char)bVar1 < '\0') {
              uVar7 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
              if ((char)*local_48 < '\0') {
                local_48 = p;
                pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar7);
                local_48 = (byte *)pVar10.first;
                this->custompaddingback_ = pVar10.second;
                goto joined_r0x00267f23;
              }
              local_48 = p + 2;
            }
            this->custompaddingback_ = uVar7;
            goto LAB_00267f64;
          }
          break;
        case 0x52:
          if (cVar6 == -0x70) {
            bVar1 = *p;
            uVar7 = (uint)bVar1;
            local_48 = p + 1;
            if ((char)bVar1 < '\0') {
              uVar7 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
              if ((char)*local_48 < '\0') {
                local_48 = p;
                pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar7);
                local_48 = (byte *)pVar10.first;
                this->custompaddingtop_ = pVar10.second;
                goto joined_r0x00267f23;
              }
              local_48 = p + 2;
            }
            this->custompaddingtop_ = uVar7;
            goto LAB_00267f64;
          }
          break;
        case 0x53:
          if (cVar6 == -0x68) {
            bVar1 = *p;
            uVar7 = (uint)bVar1;
            local_48 = p + 1;
            if ((char)bVar1 < '\0') {
              uVar7 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
              if ((char)*local_48 < '\0') {
                local_48 = p;
                pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar7);
                local_48 = (byte *)pVar10.first;
                this->custompaddingbottom_ = pVar10.second;
                goto joined_r0x00267f23;
              }
              local_48 = p + 2;
            }
            this->custompaddingbottom_ = uVar7;
            goto LAB_00267f64;
          }
          break;
        case 0x54:
          if (cVar6 == -0x60) {
            bVar1 = *p;
            uVar7 = (uint)bVar1;
            local_48 = p + 1;
            if ((char)bVar1 < '\0') {
              uVar7 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
              if ((char)*local_48 < '\0') {
                local_48 = p;
                pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar7);
                local_48 = (byte *)pVar10.first;
                this->custompaddingleft_ = pVar10.second;
                goto joined_r0x00267f23;
              }
              local_48 = p + 2;
            }
            this->custompaddingleft_ = uVar7;
            goto LAB_00267f64;
          }
          break;
        case 0x55:
          if (cVar6 == -0x58) {
            bVar1 = *p;
            uVar7 = (uint)bVar1;
            local_48 = p + 1;
            if ((char)bVar1 < '\0') {
              uVar7 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
              if ((char)*local_48 < '\0') {
                local_48 = p;
                pVar10 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar7);
                local_48 = (byte *)pVar10.first;
                this->custompaddingright_ = pVar10.second;
                goto joined_r0x00267f23;
              }
              local_48 = p + 2;
            }
            this->custompaddingright_ = uVar7;
            goto LAB_00267f64;
          }
          break;
        case 0x56:
          if (cVar6 == -0x50) {
            uVar4 = (ulong)(char)*p;
            local_48 = p + 1;
            if ((long)uVar4 < 0) {
              uVar7 = ((uint)*local_48 * 0x80 + (uint)*p) - 0x80;
              if ((char)*local_48 < '\0') {
                local_48 = p;
                pVar9 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
                local_48 = (byte *)pVar9.first;
                this->isdeconvolution_ = pVar9.second != 0;
                goto joined_r0x00267f23;
              }
              uVar4 = (ulong)uVar7;
              local_48 = p + 2;
            }
            this->isdeconvolution_ = uVar4 != 0;
            goto LAB_00267f64;
          }
          break;
        case 0x57:
          if (cVar6 == -0x46) {
            local_48 = (byte *)google::protobuf::internal::PackedUInt64Parser
                                         (local_38,(char *)p,ctx);
          }
          else {
            if ((uVar7 & 0xff) != 0xb8) break;
            value = google::protobuf::internal::ReadVarint64((char **)&local_48);
            _internal_add_outputshape(this,value);
          }
          goto joined_r0x00267f23;
        }
switchD_002676d6_caseD_17:
        if ((uVar7 == 0) || ((uVar7 & 7) == 4)) {
          if (p == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar7 - 1;
          return (char *)p;
        }
        if ((local_40->ptr_ & 1U) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(local_40);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((local_40->ptr_ & 0xfffffffffffffffcU) + 8);
        }
        local_48 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (uVar7,unknown,(char *)local_48,ctx);
joined_r0x00267f23:
        if (local_48 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
LAB_00267f64:
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_48;
}

Assistant:

const char* Convolution3DLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // int32 outputChannels = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          outputchannels_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 inputChannels = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          inputchannels_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 nGroups = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 80)) {
          ngroups_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 kernelDepth = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 160)) {
          kerneldepth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 kernelHeight = 21;
      case 21:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 168)) {
          kernelheight_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 kernelWidth = 22;
      case 22:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 176)) {
          kernelwidth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 strideDepth = 31;
      case 31:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 248)) {
          stridedepth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 strideHeight = 32;
      case 32:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 0)) {
          strideheight_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 strideWidth = 33;
      case 33:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          stridewidth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 dilationDepth = 40;
      case 40:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 64)) {
          dilationdepth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 dilationHeight = 41;
      case 41:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 72)) {
          dilationheight_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 dilationWidth = 42;
      case 42:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 80)) {
          dilationwidth_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool hasBias = 50;
      case 50:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 144)) {
          hasbias_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.WeightParams weights = 60;
      case 60:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 226)) {
          ptr = ctx->ParseMessage(_internal_mutable_weights(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.WeightParams bias = 61;
      case 61:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 234)) {
          ptr = ctx->ParseMessage(_internal_mutable_bias(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Convolution3DLayerParams.PaddingType paddingType = 70;
      case 70:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 48)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_paddingtype(static_cast<::CoreML::Specification::Convolution3DLayerParams_PaddingType>(val));
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingFront = 80;
      case 80:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 128)) {
          custompaddingfront_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingBack = 81;
      case 81:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 136)) {
          custompaddingback_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingTop = 82;
      case 82:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 144)) {
          custompaddingtop_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingBottom = 83;
      case 83:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 152)) {
          custompaddingbottom_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingLeft = 84;
      case 84:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 160)) {
          custompaddingleft_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 customPaddingRight = 85;
      case 85:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 168)) {
          custompaddingright_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool isDeconvolution = 86;
      case 86:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 176)) {
          isdeconvolution_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated uint64 outputShape = 87;
      case 87:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 186)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedUInt64Parser(_internal_mutable_outputshape(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 184) {
          _internal_add_outputshape(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}